

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Expression.cpp
# Opt level: O2

bool __thiscall ExpressionValue::operator<=(ExpressionValue *this,ExpressionValue *other)

{
  bool bVar1;
  double dVar2;
  
  switch(this->type << 2 | other->type) {
  case 5:
    return (this->field_1).intValue <= (other->field_1).intValue;
  case 6:
    bVar1 = (other->field_1).floatValue < (double)(this->field_1).intValue;
    goto LAB_00169728;
  default:
    return false;
  case 9:
    dVar2 = (double)(other->field_1).intValue;
    break;
  case 10:
    dVar2 = (other->field_1).floatValue;
    break;
  case 0xf:
    bVar1 = StringLiteral::operator<=(&this->strValue,&other->strValue);
    return bVar1;
  }
  bVar1 = dVar2 < (this->field_1).floatValue;
LAB_00169728:
  return !bVar1;
}

Assistant:

bool ExpressionValue::operator<=(const ExpressionValue& other) const
{
	switch (getValueCombination(type,other.type))
	{
	case ExpressionValueCombination::II:
		return intValue <= other.intValue;
	case ExpressionValueCombination::FI:
		return floatValue <= other.intValue;
	case ExpressionValueCombination::IF:
		return intValue <= other.floatValue;
	case ExpressionValueCombination::FF:
		return floatValue <= other.floatValue;
	case ExpressionValueCombination::SS:
		return strValue <= other.strValue;
	default:
		break;
	}

	return false;
}